

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O0

void __thiscall Assimp::Exporter::FreeBlob(Exporter *this)

{
  aiExportDataBlob *this_00;
  Exporter *this_local;
  
  this_00 = this->pimpl->blob;
  if (this_00 != (aiExportDataBlob *)0x0) {
    aiExportDataBlob::~aiExportDataBlob(this_00);
    operator_delete(this_00,0x420);
  }
  this->pimpl->blob = (aiExportDataBlob *)0x0;
  std::__cxx11::string::operator=((string *)&this->pimpl->mError,"");
  return;
}

Assistant:

void Exporter::FreeBlob() {
    delete pimpl->blob;
    pimpl->blob = nullptr;

    pimpl->mError = "";
}